

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Glucose::Solver::litRedundant(Solver *this,Lit p,uint32_t abstract_levels)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  char *pcVar6;
  VarData *pVVar7;
  bool bVar8;
  int j;
  long lVar9;
  int iVar10;
  long lVar11;
  lbool local_4d;
  uint32_t local_4c;
  Lit p_1;
  Lit p_local;
  
  if ((this->analyze_stack).data != (Lit *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  local_4c = abstract_levels;
  p_local = p;
  vec<Glucose::Lit>::push(&this->analyze_stack,&p_local);
  iVar1 = (this->analyze_toclear).sz;
  lVar9 = (long)iVar1;
  while( true ) {
    iVar2 = (this->analyze_stack).sz;
    if ((long)iVar2 < 1) break;
    puVar5 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    uVar3 = (this->vardata).data[(this->analyze_stack).data[(long)iVar2 + -1].x >> 1].reason;
    (this->analyze_stack).sz = iVar2 + -1;
    if (puVar5[(ulong)uVar3 + 1] == 2) {
      local_4d.value =
           (byte)puVar5[(ulong)uVar3 + 3] & 1 ^
           (this->assigns).data[(int)puVar5[(ulong)uVar3 + 3] >> 1].value;
      bVar8 = lbool::operator==(&local_4d,(lbool)0x1);
      if (bVar8) {
        *(ulong *)(puVar5 + (ulong)uVar3 + 3) =
             CONCAT44((int)*(undefined8 *)(puVar5 + (ulong)uVar3 + 3),
                      (int)((ulong)*(undefined8 *)(puVar5 + (ulong)uVar3 + 3) >> 0x20));
      }
    }
    for (lVar11 = 4; lVar11 + -3 < (long)(int)puVar5[(ulong)uVar3 + 1]; lVar11 = lVar11 + 1) {
      p_1.x = puVar5[(ulong)uVar3 + lVar11];
      iVar10 = p_1.x >> 1;
      pcVar6 = (this->seen).data;
      if (pcVar6[iVar10] == '\0') {
        pVVar7 = (this->vardata).data;
        uVar4 = pVVar7[iVar10].level;
        if (0 < (int)uVar4) {
          if ((pVVar7[iVar10].reason == 0xffffffff) || ((local_4c >> (uVar4 & 0x1f) & 1) == 0))
          goto LAB_00112e4b;
          pcVar6[iVar10] = '\x01';
          vec<Glucose::Lit>::push(&this->analyze_stack,&p_1);
          vec<Glucose::Lit>::push(&this->analyze_toclear,&p_1);
        }
      }
    }
  }
LAB_00112e82:
  return iVar2 < 1;
LAB_00112e4b:
  for (; iVar10 = (this->analyze_toclear).sz, lVar9 < iVar10; lVar9 = lVar9 + 1) {
    (this->seen).data[(this->analyze_toclear).data[lVar9].x >> 1] = '\0';
  }
  vec<Glucose::Lit>::shrink(&this->analyze_toclear,iVar10 - iVar1);
  goto LAB_00112e82;
}

Assistant:

bool Solver::litRedundant(Lit p, uint32_t abstract_levels) {
    analyze_stack.clear();
    analyze_stack.push(p);
    int top = analyze_toclear.size();
    while(analyze_stack.size() > 0) {
        assert(reason(var(analyze_stack.last())) != CRef_Undef);
        Clause &c = ca[reason(var(analyze_stack.last()))];
        analyze_stack.pop(); //
        if(c.size() == 2 && value(c[0]) == l_False) {
            assert(value(c[1]) == l_True);
            Lit tmp = c[0];
            c[0] = c[1], c[1] = tmp;
        }

        for(int i = 1; i < c.size(); i++) {
            Lit p = c[i];
            if(!seen[var(p)]) {
                if(level(var(p)) > 0) {
                    if(reason(var(p)) != CRef_Undef && (abstractLevel(var(p)) & abstract_levels) != 0) {
                        seen[var(p)] = 1;
                        analyze_stack.push(p);
                        analyze_toclear.push(p);
                    } else {
                        for(int j = top; j < analyze_toclear.size(); j++)
                            seen[var(analyze_toclear[j])] = 0;
                        analyze_toclear.shrink(analyze_toclear.size() - top);
                        return false;
                    }
                }
            }
        }
    }

    return true;
}